

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_validate(maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *context,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
           json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *param_6)

{
  undefined1 *puVar1;
  bool bVar2;
  semantic_tag sVar3;
  int iVar4;
  walk_result wVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  long *plVar14;
  double dVar15;
  string_view_type sVar16;
  bigint n1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val_2;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  allocator<char> local_239;
  size_type *local_238;
  anon_union_32_3_053d6482_for_basic_bigint<std::allocator<unsigned_char>_>_12 local_230;
  undefined1 local_210 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  double local_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180 [2];
  long local_170 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  long *local_148;
  long local_138 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_a0;
  long local_90 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> local_68
  ;
  
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  eval_context(&local_68,context,
               &(this->
                super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ).
                super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                .keyword_name_);
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64(instance);
  if (bVar2) {
    puVar1 = &(this->
              super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ).field_0xe0;
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1);
    if (!bVar2) goto LAB_004c87d6;
    lVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                      (instance);
    lVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1);
    if (lVar8 < lVar7) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance,
                 (allocator<char> *)&local_1e8);
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_210,0,(char *)0x0,
                                  (ulong)(this->message_)._M_dataplus._M_p);
      local_238 = &local_230.common_stor_.length_;
      psVar13 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar13) {
        local_230.common_stor_.length_ = *psVar13;
        local_230.short_stor_.values_[0] = plVar9[3];
      }
      else {
        local_230.common_stor_.length_ = *psVar13;
        local_238 = (size_type *)*plVar9;
      }
      local_230._0_8_ = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      (*(this->
        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).
        super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        .super_validation_message_factory._vptr_validation_message_factory[2])
                (local_180,this,&local_68.eval_path_,instance_location);
      reporter->error_count_ = reporter->error_count_ + 1;
      wVar5 = (*reporter->_vptr_error_reporter[2])(reporter,local_180);
LAB_004c8b08:
      std::
      vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
      ::~vector(&local_80);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_160);
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
      if (local_238 != &local_230.common_stor_.length_) {
        operator_delete(local_238,local_230.common_stor_.length_ + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      if (wVar5 == abort) goto LAB_004c8bd9;
    }
  }
  else {
LAB_004c87d6:
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64(instance);
    if (bVar2) {
      puVar1 = &(this->
                super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ).field_0xe0;
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)puVar1)
      ;
      if (bVar2) {
        uVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 as_integer<unsigned_long>(instance);
        uVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 as_integer<unsigned_long>
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            puVar1);
        if (uVar11 < uVar10) {
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance,
                     (allocator<char> *)&local_1e8);
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)local_210,0,(char *)0x0,
                               (ulong)(this->message_)._M_dataplus._M_p);
          local_238 = &local_230.common_stor_.length_;
          psVar13 = puVar12 + 2;
          if ((size_type *)*puVar12 == psVar13) {
            local_230.common_stor_.length_ = *psVar13;
            local_230.short_stor_.values_[0] = puVar12[3];
          }
          else {
            local_230.common_stor_.length_ = *psVar13;
            local_238 = (size_type *)*puVar12;
          }
          local_230._0_8_ = puVar12[1];
          *puVar12 = psVar13;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    (local_180,this,&local_68.eval_path_,instance_location);
          reporter->error_count_ = reporter->error_count_ + 1;
          wVar5 = (*reporter->_vptr_error_reporter[2])(reporter,local_180);
          goto LAB_004c8b08;
        }
        goto LAB_004c8bd7;
      }
    }
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(instance);
    if ((bVar2) &&
       (sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag(instance),
       sVar3 == bigint)) {
      sVar16 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         (instance);
      basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                ((basic_bigint<std::allocator<unsigned_char>_> *)&local_238,sVar16._M_str,
                 sVar16._M_len);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&local_1e8,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ).field_0xe0,(allocator<char> *)local_180);
      basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                ((basic_bigint<std::allocator<unsigned_char>_> *)local_210,
                 local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      iVar4 = basic_bigint<std::allocator<unsigned_char>_>::compare
                        ((basic_bigint<std::allocator<unsigned_char>_> *)&local_238,
                         (basic_bigint<std::allocator<unsigned_char>_> *)local_210);
      if (iVar4 < 1) {
        bVar2 = true;
      }
      else {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  (&local_1a0,
                   (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance,
                   &local_239);
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_1a0,0,(char *)0x0,
                                    (ulong)(this->message_)._M_dataplus._M_p);
        plVar14 = plVar9 + 2;
        if ((long *)*plVar9 == plVar14) {
          local_1b0 = *plVar14;
          lStack_1a8 = plVar9[3];
          local_1c0 = &local_1b0;
        }
        else {
          local_1b0 = *plVar14;
          local_1c0 = (long *)*plVar9;
        }
        local_1b8 = plVar9[1];
        *plVar9 = (long)plVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (*(this->
          super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ).
          super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          .super_validation_message_factory._vptr_validation_message_factory[2])
                  (local_180,this,&local_68.eval_path_,instance_location);
        reporter->error_count_ = reporter->error_count_ + 1;
        uVar6 = (*reporter->_vptr_error_reporter[2])(reporter,local_180);
        reporter = (error_reporter *)(ulong)uVar6;
        std::
        vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
        ::~vector(&local_80);
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
        if (local_148 != local_138) {
          operator_delete(local_148,local_138[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_160);
        if (local_180[0] != local_170) {
          operator_delete(local_180[0],local_170[0] + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        bVar2 = uVar6 != 1;
      }
      wVar5 = (walk_result)reporter;
      if (((local_210[8] & 1) != 0) && ((pointer)local_210._32_8_ != (pointer)0x0)) {
        operator_delete((void *)local_210._32_8_,local_210._24_8_ << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (((local_230._0_8_ & 1) != 0) &&
         ((pointer)local_230.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_230.dynamic_stor_.data_,local_230.short_stor_.values_[0] << 3);
      }
      if (!bVar2) goto LAB_004c8bd9;
    }
    else {
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(instance);
      if (bVar2) {
        local_1c8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                              (instance);
        dVar15 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            &(this->
                             super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             ).field_0xe0);
        if (dVar15 < local_1c8) {
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          as_string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance,
                     (allocator<char> *)&local_1e8);
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)local_210,0,(char *)0x0,
                               (ulong)(this->message_)._M_dataplus._M_p);
          local_238 = &local_230.common_stor_.length_;
          psVar13 = puVar12 + 2;
          if ((size_type *)*puVar12 == psVar13) {
            local_230.common_stor_.length_ = *psVar13;
            local_230.short_stor_.values_[0] = puVar12[3];
          }
          else {
            local_230.common_stor_.length_ = *psVar13;
            local_238 = (size_type *)*puVar12;
          }
          local_230._0_8_ = puVar12[1];
          *puVar12 = psVar13;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    (local_180,this,&local_68.eval_path_,instance_location);
          reporter->error_count_ = reporter->error_count_ + 1;
          wVar5 = (*reporter->_vptr_error_reporter[2])(reporter,local_180);
          goto LAB_004c8b08;
        }
      }
    }
  }
LAB_004c8bd7:
  wVar5 = advance;
LAB_004c8bd9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.eval_path_.tokens_);
  if (local_68.dynamic_scope_.
      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.dynamic_scope_.
                    super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return wVar5;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter, 
            Json& /*patch*/) const final 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.is_int64() && value_.is_int64())
            {
                if (instance.template as<int64_t>() > value_.template as<int64_t>())
                {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_uint64() && value_.is_uint64())
            {
                if (instance.template as<uint64_t>() > value_.template as<uint64_t>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_string_view() && instance.tag() == semantic_tag::bigint)
            {
                auto sv1 = instance.as_string_view();
                bigint n1 = bigint::from_string(sv1.data(), sv1.length());
                auto s2 = value_.as_string();
                bigint n2 = bigint::from_string(s2.data(), s2.length());
                if (n1 > n2)
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_number())
            {
                if (instance.template as<double>() > value_.template as<double>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            return walk_result::advance;
        }